

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

void Terminate(PaUtilHostApiRepresentation *hostApi)

{
  PaUtilAllocationGroup *in_RDI;
  PaAlsaHostApiRepresentation *alsaHostApi;
  
  if (in_RDI[8].linkBlocks != (PaUtilAllocationGroupLink *)0x0) {
    PaUtil_FreeAllAllocations(in_RDI);
    PaUtil_DestroyAllocationGroup(in_RDI);
  }
  PaUtil_FreeMemory((void *)0x1137be);
  (*(code *)alsa_snd_config_update_free_global)();
  PaAlsa_CloseLibrary();
  return;
}

Assistant:

static void Terminate( struct PaUtilHostApiRepresentation *hostApi )
{
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;

    /*
        IMPLEMENT ME:
            - clean up any resources not handled by the allocation group
    */

    if( skeletonHostApi->allocations )
    {
        PaUtil_FreeAllAllocations( skeletonHostApi->allocations );
        PaUtil_DestroyAllocationGroup( skeletonHostApi->allocations );
    }

    PaUtil_FreeMemory( skeletonHostApi );
}